

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519_64_adx.h
# Opt level: O0

void fe4_invert(uint64_t *out,uint64_t *z)

{
  int local_9c;
  int i;
  fe4 t3;
  fe4 t2;
  fe4 t1;
  fe4 t0;
  uint64_t *z_local;
  uint64_t *out_local;
  
  fe4_sq(t1 + 3,z);
  fe4_sq(t2 + 3,t1 + 3);
  for (local_9c = 1; local_9c < 2; local_9c = local_9c + 1) {
    fe4_sq(t2 + 3,t2 + 3);
  }
  fe4_mul(t2 + 3,z,t2 + 3);
  fe4_mul(t1 + 3,t1 + 3,t2 + 3);
  fe4_sq(t3 + 3,t1 + 3);
  fe4_mul(t2 + 3,t2 + 3,t3 + 3);
  fe4_sq(t3 + 3,t2 + 3);
  for (local_9c = 1; local_9c < 5; local_9c = local_9c + 1) {
    fe4_sq(t3 + 3,t3 + 3);
  }
  fe4_mul(t2 + 3,t3 + 3,t2 + 3);
  fe4_sq(t3 + 3,t2 + 3);
  for (local_9c = 1; local_9c < 10; local_9c = local_9c + 1) {
    fe4_sq(t3 + 3,t3 + 3);
  }
  fe4_mul(t3 + 3,t3 + 3,t2 + 3);
  fe4_sq((uint64_t *)&stack0xffffffffffffff68,t3 + 3);
  for (local_9c = 1; local_9c < 0x14; local_9c = local_9c + 1) {
    fe4_sq((uint64_t *)&stack0xffffffffffffff68,(uint64_t *)&stack0xffffffffffffff68);
  }
  fe4_mul(t3 + 3,(uint64_t *)&stack0xffffffffffffff68,t3 + 3);
  fe4_sq(t3 + 3,t3 + 3);
  for (local_9c = 1; local_9c < 10; local_9c = local_9c + 1) {
    fe4_sq(t3 + 3,t3 + 3);
  }
  fe4_mul(t2 + 3,t3 + 3,t2 + 3);
  fe4_sq(t3 + 3,t2 + 3);
  for (local_9c = 1; local_9c < 0x32; local_9c = local_9c + 1) {
    fe4_sq(t3 + 3,t3 + 3);
  }
  fe4_mul(t3 + 3,t3 + 3,t2 + 3);
  fe4_sq((uint64_t *)&stack0xffffffffffffff68,t3 + 3);
  for (local_9c = 1; local_9c < 100; local_9c = local_9c + 1) {
    fe4_sq((uint64_t *)&stack0xffffffffffffff68,(uint64_t *)&stack0xffffffffffffff68);
  }
  fe4_mul(t3 + 3,(uint64_t *)&stack0xffffffffffffff68,t3 + 3);
  fe4_sq(t3 + 3,t3 + 3);
  for (local_9c = 1; local_9c < 0x32; local_9c = local_9c + 1) {
    fe4_sq(t3 + 3,t3 + 3);
  }
  fe4_mul(t2 + 3,t3 + 3,t2 + 3);
  fe4_sq(t2 + 3,t2 + 3);
  for (local_9c = 1; local_9c < 5; local_9c = local_9c + 1) {
    fe4_sq(t2 + 3,t2 + 3);
  }
  fe4_mul(out,t2 + 3,t1 + 3);
  return;
}

Assistant:

__attribute__((target("adx,bmi2")))
static void fe4_invert(fe4 out, const fe4 z) {
  fe4 t0;
  fe4 t1;
  fe4 t2;
  fe4 t3;
  int i;

  fe4_sq(t0, z);
  fe4_sq(t1, t0);
  for (i = 1; i < 2; ++i) {
    fe4_sq(t1, t1);
  }
  fe4_mul(t1, z, t1);
  fe4_mul(t0, t0, t1);
  fe4_sq(t2, t0);
  fe4_mul(t1, t1, t2);
  fe4_sq(t2, t1);
  for (i = 1; i < 5; ++i) {
    fe4_sq(t2, t2);
  }
  fe4_mul(t1, t2, t1);
  fe4_sq(t2, t1);
  for (i = 1; i < 10; ++i) {
    fe4_sq(t2, t2);
  }
  fe4_mul(t2, t2, t1);
  fe4_sq(t3, t2);
  for (i = 1; i < 20; ++i) {
    fe4_sq(t3, t3);
  }
  fe4_mul(t2, t3, t2);
  fe4_sq(t2, t2);
  for (i = 1; i < 10; ++i) {
    fe4_sq(t2, t2);
  }
  fe4_mul(t1, t2, t1);
  fe4_sq(t2, t1);
  for (i = 1; i < 50; ++i) {
    fe4_sq(t2, t2);
  }
  fe4_mul(t2, t2, t1);
  fe4_sq(t3, t2);
  for (i = 1; i < 100; ++i) {
    fe4_sq(t3, t3);
  }
  fe4_mul(t2, t3, t2);
  fe4_sq(t2, t2);
  for (i = 1; i < 50; ++i) {
    fe4_sq(t2, t2);
  }
  fe4_mul(t1, t2, t1);
  fe4_sq(t1, t1);
  for (i = 1; i < 5; ++i) {
    fe4_sq(t1, t1);
  }
  fe4_mul(out, t1, t0);
}